

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O3

void __thiscall OpenMD::SpatialStatistics::processFrame(SpatialStatistics *this,int param_1)

{
  undefined4 *puVar1;
  uint uVar2;
  StuntDouble *pSVar3;
  long lVar4;
  int i;
  int local_64;
  SelectionSet local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  if ((this->evaluator_).isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_60,&this->evaluator_);
    lVar4 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar4),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&((local_60.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar4));
      lVar4 = lVar4 + 0x28;
    } while (lVar4 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_60.bitsets_);
  }
  pSVar3 = SelectionManager::beginSelected(&this->seleMan_,&local_64);
  if (pSVar3 != (StuntDouble *)0x0) {
    do {
      lVar4 = *(long *)((long)&(pSVar3->snapshotMan_->currentSnapshot_->atomData).position.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + pSVar3->storage_);
      puVar1 = (undefined4 *)(lVar4 + (long)pSVar3->localIndex_ * 0x18);
      local_48 = *puVar1;
      uStack_44 = puVar1[1];
      uStack_40 = puVar1[2];
      uStack_3c = puVar1[3];
      local_38 = *(undefined8 *)(lVar4 + 0x10 + (long)pSVar3->localIndex_ * 0x18);
      uVar2 = (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this,&local_48);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,pSVar3,(ulong)uVar2);
      pSVar3 = SelectionManager::nextSelected(&this->seleMan_,&local_64);
    } while (pSVar3 != (StuntDouble *)0x0);
  }
  return;
}

Assistant:

void SpatialStatistics::processFrame(int) {
    StuntDouble* sd;
    int i;

    if (evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // loop over the selected atoms:
    for (sd = seleMan_.beginSelected(i); sd != NULL;
         sd = seleMan_.nextSelected(i)) {
      // figure out where that object is:
      Vector3d pos = sd->getPos();

      int bin = getBin(pos);

      // forward the work of statistics on to the subclass:
      processStuntDouble(sd, bin);
    }
  }